

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InstDebugPrintfPass::GenOutputValues
          (InstDebugPrintfPass *this,Instruction *val_inst,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *val_ids,InstructionBuilder *builder)

{
  InstructionBuilder *this_00;
  uint32_t uVar1;
  uint32_t cond;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  TypeManager *this_01;
  Type *pTVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_01;
  Instruction *pIVar7;
  Instruction *pIVar8;
  Op OVar9;
  uint32_t c;
  uint uVar10;
  uint local_5c;
  uint32_t local_58 [6];
  InstructionBuilder *local_40;
  long local_38;
  undefined4 extraout_var_00;
  
  do {
    uVar1 = Instruction::type_id(val_inst);
    this_01 = IRContext::get_type_mgr((this->super_InstrumentPass).super_Pass.context_);
    pTVar5 = analysis::TypeManager::GetType(this_01,uVar1);
    switch(pTVar5->kind_) {
    case kBool:
      uVar1 = InstructionBuilder::GetUintConstantId(builder,0);
      uVar3 = InstructionBuilder::GetUintConstantId(builder,1);
      uVar4 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
      cond = Instruction::result_id(val_inst);
      val_inst = InstructionBuilder::AddSelect(builder,uVar4,cond,uVar3,uVar1);
LAB_001f65fa:
      local_58[0] = Instruction::result_id(val_inst);
LAB_001f660b:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (val_ids,local_58);
      return;
    case kInteger:
      iVar2 = (*pTVar5->_vptr_Type[9])(pTVar5);
      lVar6 = CONCAT44(extraout_var_00,iVar2);
      iVar2 = *(int *)(lVar6 + 0x24);
      if (iVar2 == 8) {
        if (*(char *)(lVar6 + 0x28) == '\x01') {
          uVar1 = InstrumentPass::GetUint8Id(&this->super_InstrumentPass);
          uVar3 = Instruction::result_id(val_inst);
          val_inst = InstructionBuilder::AddUnaryOp(builder,uVar1,OpBitcast,uVar3);
        }
        uVar1 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
        uVar3 = Instruction::result_id(val_inst);
        OVar9 = OpUConvert;
      }
      else {
        if (iVar2 != 0x20) {
          if (iVar2 != 0x40) {
            __assert_fail("false && \"unsupported int width\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp"
                          ,0x82,
                          "void spvtools::opt::InstDebugPrintfPass::GenOutputValues(Instruction *, std::vector<uint32_t> *, InstructionBuilder *)"
                         );
          }
          if (*(char *)(lVar6 + 0x28) == '\x01') {
            uVar1 = InstrumentPass::GetUint64Id(&this->super_InstrumentPass);
            uVar3 = Instruction::result_id(val_inst);
            val_inst = InstructionBuilder::AddUnaryOp(builder,uVar1,OpBitcast,uVar3);
          }
          uVar1 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
          uVar3 = Instruction::result_id(val_inst);
          pIVar7 = InstructionBuilder::AddUnaryOp(builder,uVar1,OpUConvert,uVar3);
          uVar1 = InstrumentPass::GetUint64Id(&this->super_InstrumentPass);
          uVar3 = Instruction::result_id(val_inst);
          uVar4 = InstructionBuilder::GetUintConstantId(builder,0x20);
          pIVar8 = InstructionBuilder::AddBinaryOp(builder,uVar1,OpShiftRightLogical,uVar3,uVar4);
          uVar1 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
          uVar3 = Instruction::result_id(pIVar8);
          pIVar8 = InstructionBuilder::AddUnaryOp(builder,uVar1,OpUConvert,uVar3);
          local_58[0] = Instruction::result_id(pIVar7);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (val_ids,local_58);
          local_58[0] = Instruction::result_id(pIVar8);
          goto LAB_001f660b;
        }
        if (*(char *)(lVar6 + 0x28) != '\x01') goto LAB_001f65fa;
LAB_001f6584:
        uVar1 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
        uVar3 = Instruction::result_id(val_inst);
        OVar9 = OpBitcast;
      }
      val_inst = InstructionBuilder::AddUnaryOp(builder,uVar1,OVar9,uVar3);
      goto LAB_001f65fa;
    case kFloat:
      iVar2 = (*pTVar5->_vptr_Type[0xb])(pTVar5);
      iVar2 = *(int *)(CONCAT44(extraout_var,iVar2) + 0x24);
      if (iVar2 == 0x10) {
        uVar1 = InstrumentPass::GetFloatId(&this->super_InstrumentPass);
        uVar3 = Instruction::result_id(val_inst);
        OVar9 = OpFConvert;
      }
      else {
        if (iVar2 != 0x40) {
          if (iVar2 != 0x20) {
            __assert_fail("false && \"unsupported float width\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp"
                          ,0x4e,
                          "void spvtools::opt::InstDebugPrintfPass::GenOutputValues(Instruction *, std::vector<uint32_t> *, InstructionBuilder *)"
                         );
          }
          goto LAB_001f6584;
        }
        uVar1 = InstrumentPass::GetUint64Id(&this->super_InstrumentPass);
        uVar3 = Instruction::result_id(val_inst);
        OVar9 = OpBitcast;
      }
      val_inst = InstructionBuilder::AddUnaryOp(builder,uVar1,OVar9,uVar3);
      break;
    case kVector:
      local_40 = builder;
      iVar2 = (*pTVar5->_vptr_Type[0xd])(pTVar5);
      local_38 = CONCAT44(extraout_var_01,iVar2);
      uVar1 = analysis::TypeManager::GetId(this_01,*(Type **)(local_38 + 0x28));
      this_00 = local_40;
      for (uVar10 = 0; uVar10 < *(uint *)(local_38 + 0x30); uVar10 = uVar10 + 1) {
        uVar3 = Instruction::result_id(val_inst);
        local_58[0] = 0;
        local_58[1] = 0;
        local_58[2] = 0;
        local_58[3] = 0;
        local_58[4] = 0;
        local_58[5] = 0;
        local_5c = uVar10;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_initialize<unsigned_int_const*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_58,&local_5c,local_58)
        ;
        pIVar7 = InstructionBuilder::AddCompositeExtract
                           (this_00,uVar1,uVar3,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
        GenOutputValues(this,pIVar7,val_ids,this_00);
      }
      return;
    default:
      __assert_fail("false && \"unsupported type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp"
                    ,0x87,
                    "void spvtools::opt::InstDebugPrintfPass::GenOutputValues(Instruction *, std::vector<uint32_t> *, InstructionBuilder *)"
                   );
    }
  } while( true );
}

Assistant:

void InstDebugPrintfPass::GenOutputValues(Instruction* val_inst,
                                          std::vector<uint32_t>* val_ids,
                                          InstructionBuilder* builder) {
  uint32_t val_ty_id = val_inst->type_id();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::Type* val_ty = type_mgr->GetType(val_ty_id);
  switch (val_ty->kind()) {
    case analysis::Type::kVector: {
      analysis::Vector* v_ty = val_ty->AsVector();
      const analysis::Type* c_ty = v_ty->element_type();
      uint32_t c_ty_id = type_mgr->GetId(c_ty);
      for (uint32_t c = 0; c < v_ty->element_count(); ++c) {
        Instruction* c_inst =
            builder->AddCompositeExtract(c_ty_id, val_inst->result_id(), {c});
        GenOutputValues(c_inst, val_ids, builder);
      }
      return;
    }
    case analysis::Type::kBool: {
      // Select between uint32 zero or one
      uint32_t zero_id = builder->GetUintConstantId(0);
      uint32_t one_id = builder->GetUintConstantId(1);
      Instruction* sel_inst = builder->AddSelect(
          GetUintId(), val_inst->result_id(), one_id, zero_id);
      val_ids->push_back(sel_inst->result_id());
      return;
    }
    case analysis::Type::kFloat: {
      analysis::Float* f_ty = val_ty->AsFloat();
      switch (f_ty->width()) {
        case 16: {
          // Convert float16 to float32 and recurse
          Instruction* f32_inst = builder->AddUnaryOp(
              GetFloatId(), spv::Op::OpFConvert, val_inst->result_id());
          GenOutputValues(f32_inst, val_ids, builder);
          return;
        }
        case 64: {
          // Bitcast float64 to uint64 and recurse
          Instruction* ui64_inst = builder->AddUnaryOp(
              GetUint64Id(), spv::Op::OpBitcast, val_inst->result_id());
          GenOutputValues(ui64_inst, val_ids, builder);
          return;
        }
        case 32: {
          // Bitcase float32 to uint32
          Instruction* bc_inst = builder->AddUnaryOp(
              GetUintId(), spv::Op::OpBitcast, val_inst->result_id());
          val_ids->push_back(bc_inst->result_id());
          return;
        }
        default:
          assert(false && "unsupported float width");
          return;
      }
    }
    case analysis::Type::kInteger: {
      analysis::Integer* i_ty = val_ty->AsInteger();
      switch (i_ty->width()) {
        case 64: {
          Instruction* ui64_inst = val_inst;
          if (i_ty->IsSigned()) {
            // Bitcast sint64 to uint64
            ui64_inst = builder->AddUnaryOp(GetUint64Id(), spv::Op::OpBitcast,
                                            val_inst->result_id());
          }
          // Break uint64 into 2x uint32
          Instruction* lo_ui64_inst = builder->AddUnaryOp(
              GetUintId(), spv::Op::OpUConvert, ui64_inst->result_id());
          Instruction* rshift_ui64_inst = builder->AddBinaryOp(
              GetUint64Id(), spv::Op::OpShiftRightLogical,
              ui64_inst->result_id(), builder->GetUintConstantId(32));
          Instruction* hi_ui64_inst = builder->AddUnaryOp(
              GetUintId(), spv::Op::OpUConvert, rshift_ui64_inst->result_id());
          val_ids->push_back(lo_ui64_inst->result_id());
          val_ids->push_back(hi_ui64_inst->result_id());
          return;
        }
        case 8: {
          Instruction* ui8_inst = val_inst;
          if (i_ty->IsSigned()) {
            // Bitcast sint8 to uint8
            ui8_inst = builder->AddUnaryOp(GetUint8Id(), spv::Op::OpBitcast,
                                           val_inst->result_id());
          }
          // Convert uint8 to uint32
          Instruction* ui32_inst = builder->AddUnaryOp(
              GetUintId(), spv::Op::OpUConvert, ui8_inst->result_id());
          val_ids->push_back(ui32_inst->result_id());
          return;
        }
        case 32: {
          Instruction* ui32_inst = val_inst;
          if (i_ty->IsSigned()) {
            // Bitcast sint32 to uint32
            ui32_inst = builder->AddUnaryOp(GetUintId(), spv::Op::OpBitcast,
                                            val_inst->result_id());
          }
          // uint32 needs no further processing
          val_ids->push_back(ui32_inst->result_id());
          return;
        }
        default:
          // TODO(greg-lunarg): Support non-32-bit int
          assert(false && "unsupported int width");
          return;
      }
    }
    default:
      assert(false && "unsupported type");
      return;
  }
}